

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpack.cpp
# Opt level: O0

wchar_t __thiscall CharConv::readch(CharConv *this,CVmDataSource *src)

{
  int iVar1;
  long *in_RSI;
  char buf [1];
  char local_11 [17];
  
  iVar1 = (**(code **)(*in_RSI + 0x10))(in_RSI,local_11,1);
  if (iVar1 != 0) {
    err_throw(0);
  }
  return (int)local_11[0];
}

Assistant:

virtual wchar_t readch(CVmDataSource *src)
    {
        /* read a byte into our buffer */
        char buf[1];
        if (src->read(buf, 1))
            err_throw(VMERR_READ_FILE);

        /* return the character */
        return buf[0];
    }